

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O3

Point __thiscall Point::randomPoint(Point *this,int max_x,int max_y)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar7;
  double dVar4;
  double dVar5;
  Point PVar6;
  double dVar8;
  double dVar10;
  undefined1 auVar9 [16];
  double dVar11;
  
  do {
    uVar1 = rand();
    uVar2 = rand();
    iVar3 = (int)((ulong)uVar1 * 0x431bde83 >> 0x20) - (-(uint)((int)uVar1 < 0) & 0x431bde83);
    iVar7 = (int)((ulong)uVar2 * 0x431bde83 >> 0x20) - (-(uint)((int)uVar2 < 0) & 0x431bde83);
    dVar8 = (double)(int)(uVar1 + ((iVar3 >> 0x12) - (iVar3 >> 0x1f)) * -1000000);
    dVar10 = (double)(int)(uVar2 + ((iVar7 >> 0x12) - (iVar7 >> 0x1f)) * -1000000);
    auVar9._0_8_ = dVar8 + dVar8;
    auVar9._8_8_ = dVar10 + dVar10;
    auVar9 = divpd(auVar9,_DAT_00105120);
    dVar10 = auVar9._0_8_ + -1.0;
    dVar11 = auVar9._8_8_ + -1.0;
    dVar8 = SQRT(dVar10 * dVar10 + dVar11 * dVar11);
  } while (1.0 < dVar8);
  dVar4 = log(dVar8);
  dVar4 = (dVar4 * -2.0) / dVar8;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  dVar5 = log(dVar8);
  dVar8 = (dVar5 * -2.0) / dVar8;
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  dVar10 = ceil(dVar10 * dVar4 * (double)max_x);
  dVar8 = ceil(dVar11 * dVar8 * (double)max_y);
  PVar6.x = (int)dVar10;
  PVar6.y = (int)dVar8;
  *this = PVar6;
  return (Point)this;
}

Assistant:

Point Point::randomPoint(int max_x, int max_y){
	double v1 = 2*((double)(rand()%MAAAX))/MAAAX - 1;
	double v2 = 2*((double)(rand()%MAAAX))/	MAAAX - 1;
	double s = sqrt(v1*v1 + v2*v2);
	if (s > 1){
		return randomPoint(max_x, max_y);
	}
	double u1 = v1*sqrt(-2*log(s)/s);
	double u2 = v2*sqrt(-2*log(s)/s);
	u1 = u1;
	u2 = u2;
	int x = ceil(max_x*u1);
	int y = ceil(max_y*u2);
	return Point(x, y);
}